

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferToBufferInvertTestInstance *this)

{
  deUint32 *__return_storage_ptr___00;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  deUint32 queueFamilyIndex_00;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  Allocation *pAVar7;
  void *pvVar8;
  uint *puVar9;
  VkDeviceSize VVar10;
  DescriptorSetLayoutBuilder *pDVar11;
  DescriptorPoolBuilder *pDVar12;
  Handle<(vk::HandleType)21> *pHVar13;
  Handle<(vk::HandleType)19> *pHVar14;
  VkBuffer *pVVar15;
  Handle<(vk::HandleType)22> *pHVar16;
  DescriptorSetUpdateBuilder *pDVar17;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar18;
  Handle<(vk::HandleType)14> *pHVar19;
  Handle<(vk::HandleType)24> *pHVar20;
  VkCommandBuffer_s **ppVVar21;
  Handle<(vk::HandleType)18> *pHVar22;
  VkDeviceMemory memory;
  void *pvVar23;
  ostream *poVar24;
  VkDescriptorType descriptorType;
  IVec3 *this_01;
  allocator<char> local_859;
  string local_858;
  undefined4 local_834;
  string local_830;
  ostringstream local_810 [8];
  ostringstream msg;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx;
  UVec4 *refBufferPtr;
  UVec4 *bufferPtr;
  Allocation *outputBufferAllocation;
  Move<vk::VkCommandBuffer_s_*> local_650;
  RefData<vk::VkCommandBuffer_s_*> local_630;
  undefined1 local_610 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_5d0;
  undefined1 local_5b0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_588 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  undefined1 local_548 [8];
  VkBufferMemoryBarrier hostWriteBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_500;
  RefData<vk::Handle<(vk::HandleType)18>_> local_4e0;
  undefined1 local_4c0 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_498;
  RefData<vk::Handle<(vk::HandleType)16>_> local_478;
  undefined1 local_458 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_430;
  Move<vk::Handle<(vk::HandleType)14>_> local_410;
  RefData<vk::Handle<(vk::HandleType)14>_> local_3f0;
  undefined1 local_3d0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Location local_3a0;
  VkDescriptorSet local_398;
  DescriptorSetUpdateBuilder local_390;
  deUint64 local_348;
  undefined1 local_340 [8];
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  undefined1 local_320 [8];
  VkDescriptorBufferInfo inputBufferDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_280;
  RefData<vk::Handle<(vk::HandleType)21>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1b8;
  undefined1 local_198 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_170;
  undefined1 local_138 [8];
  Buffer outputBuffer;
  uint local_fc;
  deUint32 i;
  UVec4 *bufferPtr_1;
  Allocation *inputBufferAllocation;
  undefined1 local_d4 [8];
  Random rnd;
  undefined1 local_88 [8];
  Buffer inputBuffer;
  VkDeviceSize bufferSizeBytes;
  deUint32 randomSeed;
  VkDescriptorType inputBufferDescriptorType;
  VkBufferUsageFlags inputBufferUsageFlags;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  BufferToBufferInvertTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER - (this->m_bufferType == BUFFER_TYPE_UNIFORM);
  dVar3 = 0x124fef;
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    dVar3 = 0x111223f;
  }
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((ulong)this->m_numValues << 4);
  __return_storage_ptr___00 = &rnd.m_rnd.w;
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)__return_storage_ptr___00,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,(uint)(this->m_bufferType != BUFFER_TYPE_UNIFORM) * 0x10 + 0x10);
  rnd.m_rnd.z = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_88,vk_00,device_00,allocator_00,
             (VkBufferCreateInfo *)__return_storage_ptr___00,::vk::MemoryRequirement::HostVisible);
  de::Random::Random((Random *)local_d4,dVar3);
  pAVar7 = compute::Buffer::getAllocation((Buffer *)local_88);
  pvVar8 = ::vk::Allocation::getHostPtr(pAVar7);
  for (local_fc = 0; local_fc < this->m_numValues; local_fc = local_fc + 1) {
    dVar3 = de::Random::getUint32((Random *)local_d4);
    puVar9 = tcu::Vector<unsigned_int,_4>::x
                       ((Vector<unsigned_int,_4> *)((long)pvVar8 + (ulong)local_fc * 0x10));
    *puVar9 = dVar3;
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar7);
  VVar10 = ::vk::Allocation::getOffset(pAVar7);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,VVar10,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  de::Random::~Random((Random *)local_d4);
  makeBufferCreateInfo
            (&local_170,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_138,vk_00,device_00,allocator_00,&local_170,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,descriptorType,0x20);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar11,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1d8,pDVar11,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data.deleter.m_deviceIface._0_4_ = (int)local_1b8.deleter.m_deviceIface;
  data.object.m_internal = local_1b8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_1b8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_1b8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_1b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_198,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_1d8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,descriptorType,1);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType(pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_280,pDVar12,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&local_280);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_260.deleter.m_deviceIface;
  data_00.object.m_internal = local_260.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_260.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_260.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_260.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_260.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_240,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_280);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_240);
  descriptorPool_00.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_198);
  inputBufferDescriptorInfo.range = pHVar14->m_internal;
  makeDescriptorSet(&local_2f8,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)inputBufferDescriptorInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_01.object.m_internal = local_2d8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_2d8.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_2d8.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_2d8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2b8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_2f8);
  pVVar15 = compute::Buffer::operator*((Buffer *)local_88);
  outputBufferDescriptorInfo.range = pVVar15->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_320,(VkBuffer)outputBufferDescriptorInfo.range,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar15 = compute::Buffer::operator*((Buffer *)local_138);
  local_348 = pVVar15->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_340,(VkBuffer)local_348,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_390);
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
  local_398.m_internal = pHVar16->m_internal;
  local_3a0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar17 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_390,local_398,&local_3a0,descriptorType,
                       (VkDescriptorBufferInfo *)local_320);
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
  destSet.m_internal = pHVar16->m_internal;
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar17 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar17,destSet,
                       (Location *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_340);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar17,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_390);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_430);
  ::vk::createShaderModule(&local_410,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f0,(Move *)&local_410);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3f0.deleter.m_deviceIface;
  data_02.object.m_internal = local_3f0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_3f0.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_3f0.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_3f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3d0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_198);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makePipelineLayout(&local_498,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_478,(Move *)&local_498);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_478.deleter.m_deviceIface;
  data_03.object.m_internal = local_478.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_478.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_478.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_478.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_478.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_458,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_498);
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_458);
  pipelineLayout_00.m_internal = pHVar18->m_internal;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_3d0);
  hostWriteBarrier.size = pHVar19->m_internal;
  makeComputePipeline(&local_500,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)hostWriteBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4e0,(Move *)&local_500);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_4e0.deleter.m_deviceIface;
  data_04.object.m_internal = local_4e0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4e0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_4e0.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_4e0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_4e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_4c0,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_500);
  pVVar15 = compute::Buffer::operator*((Buffer *)local_88);
  shaderWriteBarrier.size = pVVar15->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_548,0x4000,0x20,(VkBuffer)shaderWriteBarrier.size,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar15 = compute::Buffer::operator*((Buffer *)local_138);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar15->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_588,0x40,0x2000,
             (VkBuffer)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_5d0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_5d0.deleter.m_deviceIface;
  data_05.object.m_internal = local_5d0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5d0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_5d0.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_5d0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_5d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_5b0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_5b0);
  ::vk::allocateCommandBuffer
            (&local_650,vk_00,device_00,(VkCommandPool)pHVar20->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_630,(Move *)&local_650);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_630.deleter.m_deviceIface;
  data_06.object = local_630.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_630.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_630.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_630.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_630.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_610,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_650);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  beginCommandBuffer(vk_00,*ppVVar21);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  pVVar1 = *ppVVar21;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_4c0);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,pHVar22->m_internal);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  pVVar1 = *ppVVar21;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_458);
  dVar2 = pHVar18->m_internal;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,1,dVar2,0,1,pHVar16,0,0);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar21,0x4000,0x800,0,0,0,1,local_548,0,0);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  pVVar1 = *ppVVar21;
  this_01 = &this->m_workSize;
  uVar4 = tcu::Vector<int,_3>::x(this_01);
  uVar5 = tcu::Vector<int,_3>::y(this_01);
  uVar6 = tcu::Vector<int,_3>::z(this_01);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar1,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar21,0x800,0x4000,0,0,0,1,local_588,0,0);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  endCommandBuffer(vk_00,*ppVVar21);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_610);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar21);
  pAVar7 = compute::Buffer::getAllocation((Buffer *)local_138);
  memory = ::vk::Allocation::getMemory(pAVar7);
  VVar10 = ::vk::Allocation::getOffset(pAVar7);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,memory,VVar10,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pvVar8 = ::vk::Allocation::getHostPtr(pAVar7);
  pAVar7 = compute::Buffer::getAllocation((Buffer *)local_88);
  pvVar23 = ::vk::Allocation::getHostPtr(pAVar7);
  ref = 0;
  do {
    if (this->m_numValues <= ref) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"Compute succeeded",&local_859);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_858);
      std::__cxx11::string::~string((string *)&local_858);
      std::allocator<char>::~allocator(&local_859);
      local_834 = 1;
LAB_00ce8c4b:
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_610);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_5b0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_4c0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_458);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3d0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_240);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_198);
      compute::Buffer::~Buffer((Buffer *)local_138);
      compute::Buffer::~Buffer((Buffer *)local_88);
      return __return_storage_ptr__;
    }
    uVar4 = tcu::Vector<unsigned_int,_4>::x
                      ((Vector<unsigned_int,_4> *)((long)pvVar8 + (ulong)ref * 0x10));
    uVar5 = tcu::Vector<unsigned_int,_4>::x
                      ((Vector<unsigned_int,_4> *)((long)pvVar23 + (ulong)ref * 0x10));
    if (uVar4 != (uVar5 ^ 0xffffffff)) {
      std::__cxx11::ostringstream::ostringstream(local_810);
      poVar24 = std::operator<<((ostream *)local_810,"Comparison failed for Output.values[");
      poVar24 = (ostream *)std::ostream::operator<<(poVar24,ref);
      std::operator<<(poVar24,"]");
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      local_834 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_810);
      goto LAB_00ce8c4b;
    }
    ref = ref + 1;
  } while( true );
}

Assistant:

tcu::TestStatus BufferToBufferInvertTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Customize the test based on buffer type

	const VkBufferUsageFlags inputBufferUsageFlags		= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const VkDescriptorType inputBufferDescriptorType	= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
	const deUint32 randomSeed							= (m_bufferType == BUFFER_TYPE_UNIFORM ? 0x111223f : 0x124fef);

	// Create an input buffer

	const VkDeviceSize bufferSizeBytes = sizeof(tcu::UVec4) * m_numValues;
	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, inputBufferUsageFlags), MemoryRequirement::HostVisible);

	// Fill the input buffer with data
	{
		de::Random rnd(randomSeed);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < m_numValues; ++i)
			bufferPtr[i].x() = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create an output buffer

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(inputBufferDescriptorType, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(inputBufferDescriptorType)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo inputBufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, bufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), inputBufferDescriptorType, &inputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier hostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, bufferSizeBytes);

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &hostWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(outputBufferAllocation.getHostPtr());
	const tcu::UVec4* refBufferPtr = static_cast<tcu::UVec4*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < m_numValues; ++ndx)
	{
		const deUint32 res = bufferPtr[ndx].x();
		const deUint32 ref = ~refBufferPtr[ndx].x();

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}